

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O1

int lws_role_call_adoption_bind(lws *wsi,int type,char *prot)

{
  lws_vhost *plVar1;
  bool bVar2;
  int iVar3;
  lws_role_ops *plVar4;
  char *pcVar5;
  lws_role_ops *ar;
  lws_role_ops **pplVar6;
  char *unaff_R15;
  
  plVar1 = wsi->vhost;
  if (((plVar1->options & 0x400000) == 0) ||
     (unaff_R15 = plVar1->listen_accept_role, unaff_R15 == (char *)0x0)) goto LAB_00112b25;
  plVar4 = lws_role_by_name(unaff_R15);
  if (prot == (char *)0x0) {
    prot = plVar1->listen_accept_protocol;
  }
  if (plVar4 == (lws_role_ops *)0x0) {
    _lws_log(1,"%s: can\'t find role \'%s\'\n","lws_role_call_adoption_bind",unaff_R15);
LAB_00112bea:
    if (((uint)type >> 0x18 & 1) == 0) {
      _lws_log(2,"%s: adoption bind to role \'%s\', protocol \'%s\', type 0x%x, failed\n",
               "lws_role_call_adoption_bind",wsi->vhost->listen_accept_role,prot,type);
      bVar2 = true;
    }
    else {
      bVar2 = false;
      _lws_log(0x10,"%s: leaving bound to role %s\n","lws_role_call_adoption_bind",
               wsi->role_ops->name);
      unaff_R15 = (char *)0x0;
    }
  }
  else {
    if (plVar4->adoption_bind == (_func_int_lws_ptr_int_char_ptr *)0x0) goto LAB_00112bea;
    iVar3 = (*plVar4->adoption_bind)(wsi,type,prot);
    unaff_R15 = (char *)0x0;
    if (iVar3 < 0) {
      unaff_R15 = (char *)0xffffffff;
    }
    else if (iVar3 == 0) goto LAB_00112bea;
    bVar2 = false;
  }
  if (!bVar2) {
    return (int)unaff_R15;
  }
LAB_00112b25:
  pplVar6 = available_roles;
  do {
    plVar4 = *pplVar6;
    if (plVar4 == (lws_role_ops *)0x0) {
      iVar3 = (int)unaff_R15;
      break;
    }
    if (plVar4->adoption_bind == (_func_int_lws_ptr_int_char_ptr *)0x0) {
LAB_00112b57:
      bVar2 = true;
      pcVar5 = (char *)((ulong)unaff_R15 & 0xffffffff);
    }
    else {
      iVar3 = (*plVar4->adoption_bind)(wsi,type,prot);
      bVar2 = false;
      pcVar5 = (char *)0x0;
      if (iVar3 == 0) goto LAB_00112b57;
    }
    iVar3 = (int)pcVar5;
    pplVar6 = pplVar6 + 1;
    unaff_R15 = pcVar5;
  } while (bVar2);
  if (plVar4 == (lws_role_ops *)0x0) {
    iVar3 = rops_adoption_bind_raw_skt(wsi,type,prot);
    if ((iVar3 == 0) && (iVar3 = rops_adoption_bind_raw_file(wsi,type,prot), iVar3 == 0)) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
    }
  }
  return iVar3;
}

Assistant:

int
lws_role_call_adoption_bind(struct lws *wsi, int type, const char *prot)
{
	int n;

	/*
	 * if the vhost is told to bind accepted sockets to a given role,
	 * then look it up by name and try to bind to the specific role.
	 */
	if (lws_check_opt(wsi->vhost->options,
			  LWS_SERVER_OPTION_ADOPT_APPLY_LISTEN_ACCEPT_CONFIG) &&
	    wsi->vhost->listen_accept_role) {
		const struct lws_role_ops *role =
			lws_role_by_name(wsi->vhost->listen_accept_role);

		if (!prot)
			prot = wsi->vhost->listen_accept_protocol;

		if (!role)
			lwsl_err("%s: can't find role '%s'\n", __func__,
				  wsi->vhost->listen_accept_role);

		if (role && role->adoption_bind) {
			n = role->adoption_bind(wsi, type, prot);
			if (n < 0)
				return -1;
			if (n) /* did the bind */
				return 0;
		}

		if (type & _LWS_ADOPT_FINISH) {
			lwsl_debug("%s: leaving bound to role %s\n", __func__,
				   wsi->role_ops->name);
			return 0;
		}


		lwsl_warn("%s: adoption bind to role '%s', "
			  "protocol '%s', type 0x%x, failed\n", __func__,
			  wsi->vhost->listen_accept_role, prot, type);
	}

	/*
	 * Otherwise ask each of the roles in order of preference if they
	 * want to bind to this accepted socket
	 */

	LWS_FOR_EVERY_AVAILABLE_ROLE_START(ar)
		if (ar->adoption_bind && ar->adoption_bind(wsi, type, prot))
			return 0;
	LWS_FOR_EVERY_AVAILABLE_ROLE_END;

	/* fall back to raw socket role if, eg, h1 not configured */

	if (role_ops_raw_skt.adoption_bind &&
	    role_ops_raw_skt.adoption_bind(wsi, type, prot))
		return 0;

	/* fall back to raw file role if, eg, h1 not configured */

	if (role_ops_raw_file.adoption_bind &&
	    role_ops_raw_file.adoption_bind(wsi, type, prot))
		return 0;

	return 1;
}